

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer.c
# Opt level: O0

void sysbvm_integer_multiplyInto
               (size_t leftWordCount,uint32_t *leftWords,size_t rightWordCount,uint32_t *rightWords,
               size_t resultWordCount,uint32_t *resultWords)

{
  ulong local_48;
  size_t i_1;
  size_t i;
  uint32_t *resultWords_local;
  size_t resultWordCount_local;
  uint32_t *rightWords_local;
  size_t rightWordCount_local;
  uint32_t *leftWords_local;
  size_t leftWordCount_local;
  
  for (i_1 = 0; i_1 < resultWordCount; i_1 = i_1 + 1) {
    resultWords[i_1] = 0;
  }
  for (local_48 = 0; local_48 < rightWordCount && local_48 < resultWordCount;
      local_48 = local_48 + 1) {
    sysbvm_integer_multiplyByWordAddingInto
              (leftWordCount,leftWords,rightWords[local_48],resultWordCount - local_48,
               resultWords + local_48);
  }
  return;
}

Assistant:

static void sysbvm_integer_multiplyInto(size_t leftWordCount, uint32_t *leftWords, size_t rightWordCount, uint32_t *rightWords, size_t resultWordCount, uint32_t *resultWords)
{
    for(size_t i = 0; i < resultWordCount; ++i)
        resultWords[i] = 0;

    for(size_t i = 0; i < rightWordCount && i < resultWordCount; ++i)
        sysbvm_integer_multiplyByWordAddingInto(leftWordCount, leftWords, rightWords[i], resultWordCount - i, resultWords + i);
}